

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Lookup.cpp
# Opt level: O1

u64 __thiscall idx2::GetLinearBrick(idx2 *this,idx2_file *Idx2,int Level,v3i Brick3)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  u64 uVar4;
  byte bVar5;
  undefined4 in_register_00000014;
  long lVar6;
  long lVar7;
  uint auStack_370 [212];
  code *pcStack_20;
  undefined8 local_10;
  undefined4 local_8;
  
  local_10 = CONCAT44(in_register_00000014,Level);
  local_8 = Brick3.field_0._0_4_;
  lVar2 = *(long *)(this + 0x640);
  lVar3 = (long)(int)Idx2 * 0x81;
  bVar1 = *(byte *)(lVar2 + 0x80 + lVar3);
  if ((ulong)bVar1 == 0) {
    uVar4 = 0;
  }
  else {
    lVar6 = (ulong)bVar1 + 1;
    bVar5 = 0;
    uVar4 = 0;
    do {
      if (0x80 < bVar1) {
        pcStack_20 = GetSpatialBrick;
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x237,"char &idx2::stack_string<128>::operator[](int) const [N = 128]");
      }
      lVar7 = (long)*(char *)(lVar2 + lVar3 + -2 + lVar6);
      if (0x5a < lVar7) {
        pcStack_20 = (code *)0x191965;
        __assert_fail("Idx < 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
      }
      uVar4 = uVar4 | (ulong)(auStack_370[lVar7 + 0x80] & 1) << (bVar5 & 0x3f);
      auStack_370[lVar7 + 0x80] = (int)auStack_370[lVar7 + 0x80] >> 1;
      lVar6 = lVar6 + -1;
      bVar5 = bVar5 + 1;
    } while (1 < lVar6);
  }
  return uVar4;
}

Assistant:

u64
GetLinearBrick(const idx2_file& Idx2, int Level, v3i Brick3)
{
  u64 LinearBrick = 0;
  int Size = Idx2.BricksOrderStr[Level].Len;
  for (int I = Size - 1; I >= 0; --I)
  {
    int D = Idx2.BricksOrderStr[Level][I] - 'X';
    LinearBrick |= (Brick3[D] & u64(1)) << (Size - I - 1);
    Brick3[D] >>= 1;
  }
  return LinearBrick;
}